

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zetCommandListAppendMarkerExp
          (zet_command_list_handle_t hCommandList,zet_metric_group_handle_t hMetricGroup,
          uint32_t value)

{
  zet_pfnCommandListAppendMarkerExp_t pfnAppendMarkerExp;
  dditable_t *dditable;
  ze_result_t result;
  uint32_t value_local;
  zet_metric_group_handle_t hMetricGroup_local;
  zet_command_list_handle_t hCommandList_local;
  
  if (*(code **)(*(long *)(hCommandList + 8) + 0x710) == (code *)0x0) {
    hCommandList_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hCommandList_local._4_4_ =
         (**(code **)(*(long *)(hCommandList + 8) + 0x710))
                   (*(undefined8 *)hCommandList,*(undefined8 *)hMetricGroup,value);
  }
  return hCommandList_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetCommandListAppendMarkerExp(
        zet_command_list_handle_t hCommandList,         ///< [in] handle to the command list
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle to the marker metric group.
                                                        ///< ::zet_metric_group_type_exp_flags_t could be used to check whether
                                                        ///< marker is supoported by the metric group.
        uint32_t value                                  ///< [in] marker value
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_command_list_object_t*>( hCommandList )->dditable;
        auto pfnAppendMarkerExp = dditable->zet.CommandListExp.pfnAppendMarkerExp;
        if( nullptr == pfnAppendMarkerExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<zet_command_list_object_t*>( hCommandList )->handle;

        // convert loader handle to driver handle
        hMetricGroup = reinterpret_cast<zet_metric_group_object_t*>( hMetricGroup )->handle;

        // forward to device-driver
        result = pfnAppendMarkerExp( hCommandList, hMetricGroup, value );

        return result;
    }